

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O1

void __thiscall OpenMD::IndexFinder::IndexFinder(IndexFinder *this,SimInfo *info)

{
  vector<int,_std::allocator<int>_> *this_00;
  iterator iVar1;
  EVP_PKEY_CTX *ctx;
  int local_24;
  
  this->info_ = info;
  this_00 = &this->nObjects_;
  (this->selectionSets_).
  super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->selectionSets_).
  super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->selectionSets_).
  super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar1._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = info->nGlobalRigidBodies_ + info->nGlobalAtoms_;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = this->info_->nGlobalBonds_;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = this->info_->nGlobalBends_;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = this->info_->nGlobalTorsions_;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = this->info_->nGlobalInversions_;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar1,&local_24);
  }
  else {
    *iVar1._M_current = this->info_->nGlobalMols_;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  ctx = (EVP_PKEY_CTX *)(long)this->info_->nGlobalMols_;
  std::vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::resize
            (&this->selectionSets_,(size_type)ctx);
  init(this,ctx);
  return;
}

Assistant:

IndexFinder::IndexFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    selectionSets_.resize(info_->getNGlobalMolecules());
    init();
  }